

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O0

void __thiscall Token::Token(Token *this)

{
  allocator<char> local_26;
  allocator<char> local_25 [20];
  allocator<char> local_11;
  Token *local_10;
  Token *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)this,"",&local_11);
  std::allocator<char>::~allocator(&local_11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->_relOp,"",local_25);
  std::allocator<char>::~allocator(local_25);
  this->_eof = false;
  this->_eol = false;
  this->_ind = false;
  this->_ded = false;
  this->_isWholeNumber = false;
  this->_isString = false;
  this->_symbol = '\0';
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->_string,"",&local_26);
  std::allocator<char>::~allocator(&local_26);
  return;
}

Assistant:

Token::Token(): _name{""}, _eof{false}, _eol{false}, _symbol{'\0'},
_isWholeNumber{false}, _ind{false},_ded{false}, _relOp{""}, _string{""},_isString{false}{}